

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_wrapper.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::
container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
::container_wrapper(container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                    *this,array<libtorrent::str_setting_entry_t,_13UL> *b)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  char *pcVar3;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  
  lVar8 = 0;
  do {
    puVar1 = (undefined4 *)
             ((long)&(this->super_array<libtorrent::str_setting_entry_t,_13UL>)._M_elems[0].name +
             lVar8);
    *(undefined8 *)(puVar1 + 4) = *(undefined8 *)(&b->_M_elems[0].field_0x10 + lVar8);
    puVar2 = (undefined4 *)((long)&b->_M_elems[0].name + lVar8);
    uVar5 = puVar2[1];
    uVar6 = puVar2[2];
    uVar7 = puVar2[3];
    *puVar1 = *puVar2;
    puVar1[1] = uVar5;
    puVar1[2] = uVar6;
    puVar1[3] = uVar7;
    pcVar3 = (this->super_array<libtorrent::str_setting_entry_t,_13UL>)._M_elems[0].default_value.
             field_2._M_local_buf + lVar8;
    *(char **)(pcVar3 + -0x10) = pcVar3;
    lVar4 = *(long *)((long)&b->_M_elems[0].default_value._M_dataplus._M_p + lVar8);
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar1 + 6),lVar4,
               *(long *)((long)&b->_M_elems[0].default_value._M_string_length + lVar8) + lVar4);
    lVar8 = lVar8 + 0x38;
  } while (lVar8 != 0x2d8);
  return;
}

Assistant:

constexpr explicit container_wrapper(Base&& b) noexcept : Base(std::move(b)) {}